

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

size_t NodeSize(nodeclass *Class)

{
  size_t sVar1;
  nodemeta *pnVar2;
  
  if (*(int *)&Class[1].Meta == 0x444f4d4e) {
    sVar1 = 0x58;
  }
  else {
    sVar1 = 0;
    while ((Class != (nodeclass *)0x0 && (sVar1 == 0))) {
      for (pnVar2 = Class->Meta; pnVar2 != (nodemeta *)0x0; pnVar2 = pnVar2 + 1) {
        sVar1 = (size_t)*(byte *)pnVar2;
        if (sVar1 == 0) goto LAB_00106795;
        if (*(byte *)pnVar2 == 10) {
          sVar1 = pnVar2->Data;
          goto LAB_00106795;
        }
      }
      sVar1 = 0;
LAB_00106795:
      Class = Class->ParentClass;
    }
  }
  return sVar1;
}

Assistant:

static NOINLINE size_t NodeSize(const nodeclass* Class)
{
    const nodeclass *j;
    const nodemeta* m;
    size_t Size = 0;

    if (NodeClass_ClassId(Class) == NODEMODULE_CLASS)
        return sizeof(nodemodule); // for NodeContext_Done when all classes are already released

    for (j=Class;j && !Size;j=j->ParentClass)
        for (m=j->Meta;m && m->Meta != META_CLASS_PARENT_ID;++m)
            if (m->Meta == META_CLASS_SIZE)
            {
                Size = (size_t)m->Data;
                break;
            }

    return Size;
}